

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aomstats.c
# Opt level: O3

void stats_close(stats_io_t *stats,int last_pass)

{
  FILE *__stream;
  
  __stream = (FILE *)stats->file;
  if (__stream == (FILE *)0x0) {
    if (stats->pass == last_pass) {
      free((stats->buf).buf);
      return;
    }
  }
  else {
    if (stats->pass == last_pass) {
      free((stats->buf).buf);
      __stream = (FILE *)stats->file;
    }
    fclose(__stream);
    stats->file = (FILE *)0x0;
  }
  return;
}

Assistant:

void stats_close(stats_io_t *stats, int last_pass) {
  if (stats->file) {
    if (stats->pass == last_pass) {
      free(stats->buf.buf);
    }

    fclose(stats->file);
    stats->file = NULL;
  } else {
    if (stats->pass == last_pass) free(stats->buf.buf);
  }
}